

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall
TPZFMatrix<long>::TimesBetaPlusZ(TPZFMatrix<long> *this,long beta,TPZFMatrix<long> *z)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  
  lVar4 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  if (0 < lVar4) {
    plVar3 = this->fElem;
    plVar1 = plVar3 + lVar4;
    plVar5 = z->fElem;
    do {
      lVar4 = *plVar3;
      *plVar3 = lVar4 * beta;
      lVar2 = *plVar5;
      plVar5 = plVar5 + 1;
      *plVar3 = lVar4 * beta + lVar2;
      plVar3 = plVar3 + 1;
    } while (plVar3 < plVar1);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}